

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

void __thiscall Fl_Tree::draw(Fl_Tree *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Fl_Boxtype t;
  int iVar5;
  Fl_Tree_Select FVar6;
  Fl_Tree *pFVar7;
  Fl_Tree_Item *this_00;
  int local_58;
  int tgt;
  bool before;
  int mid;
  int h;
  Fl_Tree_Item *item;
  int size2;
  int range2;
  int ch;
  int scrollval;
  int ytoofar;
  Fl_Tree *this_local;
  
  iVar1 = draw_tree(this);
  uVar2 = Fl_Widget::visible((Fl_Widget *)this->_vscroll);
  if ((uVar2 != 0) && (0 < iVar1)) {
    iVar3 = Fl_Scrollbar::value(this->_vscroll);
    iVar4 = Fl_Widget::h((Fl_Widget *)this);
    t = Fl_Widget::box((Fl_Widget *)this);
    iVar5 = Fl::box_dh(t);
    iVar3 = iVar3 - iVar1;
    if (iVar3 < 0) {
      Fl_Scrollbar::value(this->_vscroll,0);
      (*(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[6])();
    }
    else {
      Fl_Slider::slider_size
                (&this->_vscroll->super_Fl_Slider,
                 (double)((float)(iVar4 - iVar5) / (float)((iVar4 - iVar5) + iVar3)));
      Fl_Valuator::range((Fl_Valuator *)this->_vscroll,0.0,(double)iVar3);
      Fl_Scrollbar::value(this->_vscroll,iVar3);
    }
    Fl::add_timeout(0.1,redraw_soon,this);
  }
  FVar6 = Fl_Tree_Prefs::selectmode(&this->_prefs);
  if ((((FVar6 == FL_TREE_SELECT_SINGLE_DRAGGABLE) &&
       (pFVar7 = (Fl_Tree *)Fl::pushed(), pFVar7 == this)) &&
      (this_00 = Fl_Tree_Item::find_clicked(this->_root,&this->_prefs),
      this_00 != (Fl_Tree_Item *)0x0)) && (this_00 != this->_item_focus)) {
    iVar1 = Fl::event_y();
    iVar4 = Fl_Tree_Item::y(this_00);
    iVar5 = Fl_Tree_Item::h(this_00);
    fl_color(0x38);
    iVar3 = Fl_Tree_Item::y(this_00);
    if (iVar1 - iVar4 < iVar5 / 2) {
      local_58 = 0;
    }
    else {
      local_58 = Fl_Tree_Item::h(this_00);
    }
    iVar1 = Fl_Tree_Item::x(this_00);
    iVar4 = Fl_Tree_Item::x(this_00);
    iVar5 = Fl_Tree_Item::w(this_00);
    fl_line(iVar1,iVar3 + local_58,iVar4 + iVar5,iVar3 + local_58);
  }
  return;
}

Assistant:

void Fl_Tree::draw() {
  int ytoofar = draw_tree();

  // See if we're scrolled below bottom of tree
  //   This can happen if someone just closed a large item.
  //   If so, change scroller as needed.
  //
  if ( _vscroll->visible() && ytoofar > 0 ) {
    int scrollval = _vscroll->value();
    int ch = h() - Fl::box_dh(box());
    int range2 = scrollval - ytoofar;
    int size2 = ch + range2;
    if ( range2 < 0 ) {
      _vscroll->value(0);
      _vscroll->hide();
    } else {
      _vscroll->slider_size(float(ch)/float(size2));
      _vscroll->range(0.0,range2);
      _vscroll->value(range2);
    }
    Fl::add_timeout(.10, redraw_soon, (void*)this);	// use timer to trigger redraw; we can't
  }

  // Draw dragging line
  if (_prefs.selectmode() == FL_TREE_SELECT_SINGLE_DRAGGABLE &&
      Fl::pushed() == this) {

    Fl_Tree_Item *item = _root->find_clicked(_prefs); // item we're on, vertically
    if (item && item != _item_focus) {
      // Are we dropping above or before the target item?
      const int h = Fl::event_y() - item->y();
      const int mid = item->h() / 2;
      const bool before = h < mid;

      fl_color(FL_BLACK);

      int tgt = item->y() + (before ? 0 : item->h());
      fl_line(item->x(), tgt, item->x() + item->w(), tgt);
    }
  }
}